

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Table.cxx
# Opt level: O1

void __thiscall
Fl_Table::set_selection(Fl_Table *this,int row_top,int col_left,int row_bot,int col_right)

{
  damage_zone(this,this->current_row,this->current_col,this->select_row,this->select_col,0,0);
  this->current_col = col_left;
  this->current_row = row_top;
  this->select_col = col_right;
  this->select_row = row_bot;
  damage_zone(this,row_top,col_left,row_bot,col_right,0,0);
  return;
}

Assistant:

void Fl_Table::set_selection(int row_top, int col_left, int row_bot, int col_right) {
  damage_zone(current_row, current_col, select_row, select_col);
  current_col = col_left;
  current_row = row_top;
  select_col  = col_right;
  select_row  = row_bot;
  damage_zone(current_row, current_col, select_row, select_col);
}